

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

void booster::aio::details::add<booster::aio::const_buffer>(const_buffer *left,const_buffer *right)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  pointer peVar5;
  ulong uVar6;
  
  iVar1 = (right->super_buffer_impl<const_char_*>).size_;
  if (iVar1 == 0) {
    peVar5 = (pointer)0x0;
    uVar6 = 0;
  }
  else if (iVar1 == 1) {
    peVar5 = &(right->super_buffer_impl<const_char_*>).entry_;
    uVar6 = 1;
  }
  else {
    peVar5 = (right->super_buffer_impl<const_char_*>).vec_.
             super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(right->super_buffer_impl<const_char_*>).vec_.
                  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)peVar5 >> 4;
  }
  if (uVar6 != 0) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      buffer_impl<const_char_*>::add
                (&left->super_buffer_impl<const_char_*>,peVar5[uVar3].ptr,peVar5[uVar3].size);
      bVar2 = uVar4 < uVar6;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void add(Buffer &left,Buffer const &right)
			{
				typename Buffer::buffer_data_type data=right.get();
				for(unsigned i=0;i<data.second;i++)
					left.add(data.first[i].ptr,data.first[i].size);
			}